

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_unsigned_int_&,_const_int_&> * __thiscall
Catch::ExprLhs<unsigned_int_const&>::operator&(ExprLhs<const_unsigned_int_&> *this,int *rhs)

{
  uint *in_RDX;
  undefined8 *in_RSI;
  BinaryExpr<const_unsigned_int_&,_const_int_&> *in_RDI;
  undefined1 uVar1;
  undefined7 in_stack_ffffffffffffffb8;
  char *rawChars;
  BinaryExpr<const_unsigned_int_&,_const_int_&> *this_00;
  StringRef in_stack_ffffffffffffffd8;
  
  uVar1 = (*(uint *)*in_RSI & *in_RDX) != 0;
  rawChars = (char *)*in_RSI;
  this_00 = in_RDI;
  StringRef::StringRef((StringRef *)in_RDI,rawChars);
  BinaryExpr<const_unsigned_int_&,_const_int_&>::BinaryExpr
            (this_00,SUB81((ulong)rawChars >> 0x38,0),(uint *)in_RDI,in_stack_ffffffffffffffd8,
             (int *)CONCAT17(uVar1,in_stack_ffffffffffffffb8));
  return this_00;
}

Assistant:

auto operator & (RhsT const& rhs) -> BinaryExpr<LhsT, RhsT const&> const {
            return { static_cast<bool>(m_lhs & rhs), m_lhs, "&", rhs };
        }